

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    uchar *in,size_t insize,LodePNGColorType colortype,uint bitdepth)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  uchar *buffer;
  uchar *local_2c0;
  LodePNGState local_2b8;
  
  local_2c0 = (uchar *)0x0;
  uVar4 = lodepng_decode_memory(&local_2c0,w,h,in,insize,colortype,bitdepth);
  puVar3 = local_2c0;
  if (uVar4 == 0 && local_2c0 != (uchar *)0x0) {
    local_2b8.decoder.color_convert = 1;
    local_2b8.decoder.read_text_chunks = 1;
    local_2b8.decoder.remember_unknown_chunks = 0;
    local_2b8.decoder.max_text_size = 0x1000000;
    local_2b8.decoder.max_icc_size = 0x1000000;
    local_2b8.decoder.zlibsettings.ignore_adler32 = 0;
    local_2b8.decoder.zlibsettings.ignore_nlen = 0;
    local_2b8.decoder.zlibsettings.max_output_size = 0;
    local_2b8.decoder.zlibsettings.custom_zlib =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
    local_2b8.decoder.zlibsettings.custom_inflate =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
    local_2b8.decoder.zlibsettings.custom_context = (void *)0x0;
    local_2b8.decoder.ignore_crc = 0;
    local_2b8.decoder.ignore_critical = 0;
    local_2b8.decoder.ignore_end = 0;
    local_2b8.encoder.zlibsettings.btype = 2;
    local_2b8.encoder.zlibsettings.use_lz77 = 1;
    local_2b8.encoder.zlibsettings.windowsize = 0x800;
    local_2b8.encoder.zlibsettings.minmatch = 3;
    local_2b8.encoder.zlibsettings.nicematch = 0x80;
    local_2b8.encoder.zlibsettings.lazymatching = 1;
    local_2b8.encoder.zlibsettings.custom_zlib =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_2b8.encoder.zlibsettings.custom_deflate =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_2b8.encoder.zlibsettings.custom_context = (void *)0x0;
    local_2b8.encoder.filter_strategy = LFS_MINSUM;
    local_2b8.encoder.auto_convert = 1;
    local_2b8.encoder.filter_palette_zero = 1;
    local_2b8.encoder.predefined_filters = (uchar *)0x0;
    local_2b8.encoder.force_palette = 0;
    local_2b8.encoder.add_id = 0;
    local_2b8.encoder.text_compression = 1;
    local_2b8.info_raw.key_defined = 0;
    local_2b8.info_raw.key_r = 0;
    local_2b8.info_raw.key_g = 0;
    local_2b8.info_raw.key_b = 0;
    local_2b8.info_raw.palette = (uchar *)0x0;
    local_2b8.info_raw.palettesize = 0;
    local_2b8.info_png.color.key_defined = 0;
    local_2b8.info_png.color.key_r = 0;
    local_2b8.info_png.color.key_g = 0;
    local_2b8.info_png.color.key_b = 0;
    local_2b8.info_png.color.colortype = LCT_RGBA;
    local_2b8.info_png.color.bitdepth = 8;
    local_2b8.info_png.color.palette = (uchar *)0x0;
    local_2b8.info_png.color.palettesize = 0;
    local_2b8.info_png.interlace_method = 0;
    local_2b8.info_png.compression_method = 0;
    local_2b8.info_png.filter_method = 0;
    local_2b8.info_png.phys_defined = 0;
    local_2b8.info_png.gama_defined = 0;
    local_2b8.info_png.chrm_defined = 0;
    local_2b8.info_png.srgb_defined = 0;
    local_2b8.info_png.unknown_chunks_size[1] = 0;
    local_2b8.info_png.unknown_chunks_size[2] = 0;
    local_2b8.info_png.unknown_chunks_data[2] = (uchar *)0x0;
    local_2b8.info_png.unknown_chunks_size[0] = 0;
    local_2b8.info_png.unknown_chunks_data[0] = (uchar *)0x0;
    local_2b8.info_png.unknown_chunks_data[1] = (uchar *)0x0;
    local_2b8.info_png.exif_defined = 0;
    local_2b8.info_png.itext_transkeys = (char **)0x0;
    local_2b8.info_png.itext_strings = (char **)0x0;
    local_2b8.info_png.itext_keys = (char **)0x0;
    local_2b8.info_png.itext_langtags = (char **)0x0;
    local_2b8.info_png.text_strings = (char **)0x0;
    local_2b8.info_png.itext_num = 0;
    local_2b8.info_png.text_num = 0;
    local_2b8.info_png.text_keys = (char **)0x0;
    local_2b8.info_png.background_defined = 0;
    local_2b8.info_png.background_r = 0;
    local_2b8.info_png.background_g = 0;
    local_2b8.info_png.background_b = 0;
    local_2b8.info_png.exif = (uchar *)0x0;
    local_2b8.info_png.exif_size = 0;
    local_2b8.info_png.time_defined = 0;
    local_2b8.info_png.iccp_profile._4_4_ = 0;
    local_2b8.info_png._252_8_ = 0;
    local_2b8.info_png._260_8_ = 0;
    local_2b8.info_png.sbit_r = 0;
    local_2b8.info_png.sbit_g = 0;
    local_2b8.info_png.sbit_b = 0;
    local_2b8.info_png.sbit_a = 0;
    local_2b8.info_png.clli_defined = 0;
    local_2b8.info_png.clli_max_cll = 0;
    local_2b8.info_png.clli_max_fall = 0;
    local_2b8.info_png.sbit_defined = 0;
    local_2b8.info_png.mdcv_white_x = 0;
    local_2b8.info_png.mdcv_white_y = 0;
    local_2b8.info_png.mdcv_max_luminance = 0;
    local_2b8.info_png.mdcv_min_luminance = 0;
    local_2b8.info_png.mdcv_green_x = 0;
    local_2b8.info_png.mdcv_green_y = 0;
    local_2b8.info_png.mdcv_blue_x = 0;
    local_2b8.info_png.mdcv_blue_y = 0;
    local_2b8.info_png.cicp_video_full_range_flag = 0;
    local_2b8.info_png.mdcv_defined = 0;
    local_2b8.info_png.mdcv_red_x = 0;
    local_2b8.info_png.mdcv_red_y = 0;
    local_2b8.info_png.cicp_defined = 0;
    local_2b8.info_png.cicp_color_primaries = 0;
    local_2b8.info_png.cicp_transfer_function = 0;
    local_2b8.info_png.cicp_matrix_coefficients = 0;
    local_2b8.error = 1;
    local_2b8.info_raw.bitdepth = bitdepth;
    uVar1 = *w;
    uVar2 = *h;
    local_2b8.info_raw.colortype = colortype;
    uVar5 = getNumColorChannels(colortype);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,puVar3,
               puVar3 + ((ulong)((uint)((ulong)uVar2 * (ulong)uVar1) & 7) *
                         (ulong)(uVar5 * bitdepth) + 7 >> 3) +
                        ((ulong)uVar2 * (ulong)uVar1 >> 3) * (ulong)(uVar5 * bitdepth));
    lodepng_state_cleanup(&local_2b8);
  }
  free(local_2c0);
  return uVar4;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const unsigned char* in,
                size_t insize, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer = 0;
  unsigned error = lodepng_decode_memory(&buffer, &w, &h, in, insize, colortype, bitdepth);
  if(buffer && !error) {
    State state;
    state.info_raw.colortype = colortype;
    state.info_raw.bitdepth = bitdepth;
    size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
    out.insert(out.end(), buffer, &buffer[buffersize]);
  }
  lodepng_free(buffer);
  return error;
}